

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall ot::commissioner::Interpreter::Value::Value(Value *this,string *aData)

{
  (this->mError).mCode = kNone;
  (this->mError).mMessage._M_dataplus._M_p = (pointer)&(this->mError).mMessage.field_2;
  (this->mError).mMessage._M_string_length = 0;
  (this->mError).mMessage.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->mData,(string *)aData);
  return;
}

Assistant:

Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator()
{
    if (mSuccess)
    {
        Network        nwk;
        RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

        if (status == RegistryStatus::kSuccess && mStartWith != nwk.mXpan)
        {
            Console::Write(nwk.mXpan == 0 ? WARN_NETWORK_SELECTION_DROPPED : WARN_NETWORK_SELECTION_CHANGED,
                           Console::Color::kYellow);
        }
    }
}